

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOService.cpp
# Opt level: O2

void anon_unknown.dwarf_512401::init_curious_in_channel(Caliper *c,Channel *channel)

{
  _Hash_node_value<std::pair<const_unsigned_long,_std::unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>_>,_false>
  *p_Var1;
  curious_t curious_inst;
  Events *pEVar2;
  _Head_base<0UL,_(anonymous_namespace)::user_data_t_*,_false> usr_args;
  cali_id_t cVar3;
  __node_ptr p_Var4;
  __node_ptr p_Var5;
  pointer pp_Var6;
  _Hash_node_base *p_Var7;
  _Head_base<0UL,_(anonymous_namespace)::user_data_t_*,_false> __c;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this;
  size_type __n;
  ulong uVar8;
  ulong uVar9;
  __node_ptr p_Var10;
  undefined1 auVar11 [16];
  __buckets_alloc_type __alloc;
  unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>
  data;
  _Scoped_node local_60;
  undefined8 local_50;
  cali_id_t local_48;
  _Head_base<0UL,_(anonymous_namespace)::user_data_t_*,_false> local_40;
  Caliper *c_local;
  
  c_local = c;
  pEVar2 = cali::Channel::events(channel);
  cali::util::callback<void(cali::Caliper*,cali::Attribute_const&)>::operator()
            (&pEVar2->subscribe_attribute,&c_local,
             (Attribute *)&(anonymous_namespace)::io_region_attr);
  curious_inst = curious_init(3);
  usr_args._M_head_impl = (user_data_t *)operator_new(0x18);
  (usr_args._M_head_impl)->curious_ctx = curious_inst;
  std::__shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2> *)
             &(usr_args._M_head_impl)->channel,
             (__shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2> *)channel);
  data._M_t.
  super___uniq_ptr_impl<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>
  ._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::user_data_t_*,_std::default_delete<(anonymous_namespace)::user_data_t>_>
  .super__Head_base<0UL,_(anonymous_namespace)::user_data_t_*,_false>._M_head_impl =
       (__uniq_ptr_data<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>,_true,_true>
        )(__uniq_ptr_data<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>,_true,_true>
          )usr_args._M_head_impl;
  curious_register_callback(curious_inst,0,handle_io<curious_read_record>,usr_args._M_head_impl);
  curious_register_callback(curious_inst,1,handle_io<curious_read_record>,usr_args._M_head_impl);
  curious_register_callback(curious_inst,2,handle_io<curious_write_record>,usr_args._M_head_impl);
  curious_register_callback(curious_inst,3,handle_io<curious_write_record>,usr_args._M_head_impl);
  curious_register_callback(curious_inst,4,handle_io<curious_metadata_record>,usr_args._M_head_impl)
  ;
  __c._M_head_impl = usr_args._M_head_impl;
  curious_register_callback(curious_inst,5,handle_io<curious_metadata_record>,usr_args._M_head_impl)
  ;
  cVar3 = cali::Channel::id(channel);
  data._M_t.
  super___uniq_ptr_impl<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>
  ._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::user_data_t_*,_std::default_delete<(anonymous_namespace)::user_data_t>_>
  .super__Head_base<0UL,_(anonymous_namespace)::user_data_t_*,_false>._M_head_impl =
       (__uniq_ptr_data<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>,_true,_true>
        )(__uniq_ptr_impl<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>
          )0x0;
  local_60._M_h = (__hashtable_alloc *)&(anonymous_namespace)::curious_insts;
  local_48 = cVar3;
  local_40._M_head_impl = usr_args._M_head_impl;
  p_Var4 = (__node_ptr)operator_new(0x18);
  (p_Var4->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
  local_40._M_head_impl = (user_data_t *)0x0;
  *(cali_id_t *)
   &(p_Var4->
    super__Hash_node_value<std::pair<const_unsigned_long,_std::unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>_>,_false>
    ).
    super__Hash_node_value_base<std::pair<const_unsigned_long,_std::unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>_>_>
    ._M_storage._M_storage = cVar3;
  *(user_data_t **)
   ((long)&(p_Var4->
           super__Hash_node_value<std::pair<const_unsigned_long,_std::unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>_>,_false>
           ).
           super__Hash_node_value_base<std::pair<const_unsigned_long,_std::unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>_>_>
           ._M_storage._M_storage + 8) = usr_args._M_head_impl;
  uVar9 = DAT_0029b950;
  this = (_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          *)(cVar3 % DAT_0029b950);
  local_60._M_node = p_Var4;
  p_Var5 = std::
           _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::_M_find_node(this,(size_type)
                               &p_Var4->
                                super__Hash_node_value<std::pair<const_unsigned_long,_std::unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>_>,_false>
                          ,(key_type *)this,(__hash_code)__c._M_head_impl);
  if (p_Var5 == (__node_ptr)0x0) {
    local_50 = DAT_0029b970;
    auVar11 = std::__detail::_Prime_rehash_policy::_M_need_rehash(0x29b968,uVar9,DAT_0029b960);
    __n = auVar11._8_8_;
    if ((auVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      if (__n == 1) {
        _DAT_0029b978 = 0;
        pp_Var6 = (pointer)&DAT_0029b978;
      }
      else {
        pp_Var6 = std::allocator_traits<std::allocator<std::__detail::_Hash_node_base_*>_>::allocate
                            (&__alloc,__n);
        memset(pp_Var6,0,__n * 8);
      }
      p_Var5 = DAT_0029b958;
      DAT_0029b958 = (__node_ptr)0x0;
      uVar9 = 0;
LAB_002299ae:
      p_Var10 = p_Var5;
      uVar8 = uVar9;
      if (p_Var10 != (__node_ptr)0x0) {
        p_Var5 = (__node_ptr)(p_Var10->super__Hash_node_base)._M_nxt;
        uVar9 = *(ulong *)&(p_Var10->
                           super__Hash_node_value<std::pair<const_unsigned_long,_std::unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>_>,_false>
                           ).
                           super__Hash_node_value_base<std::pair<const_unsigned_long,_std::unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>_>_>
                           ._M_storage._M_storage % __n;
        if (pp_Var6[uVar9] == (_Hash_node_base *)0x0) goto LAB_002299dd;
        (p_Var10->super__Hash_node_base)._M_nxt = pp_Var6[uVar9]->_M_nxt;
        p_Var7 = pp_Var6[uVar9];
        uVar9 = uVar8;
        goto LAB_002299fc;
      }
      std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_M_deallocate_buckets
                ((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)&(anonymous_namespace)::curious_insts);
      this = (_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              *)(cVar3 % __n);
      (anonymous_namespace)::curious_insts = pp_Var6;
      DAT_0029b950 = __n;
    }
    pp_Var6 = (anonymous_namespace)::curious_insts;
    if ((anonymous_namespace)::curious_insts[(long)this] == (_Hash_node_base *)0x0) {
      (p_Var4->super__Hash_node_base)._M_nxt = &DAT_0029b958->super__Hash_node_base;
      if (DAT_0029b958 != (__node_ptr)0x0) {
        p_Var1 = &DAT_0029b958->
                  super__Hash_node_value<std::pair<const_unsigned_long,_std::unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>_>,_false>
        ;
        DAT_0029b958 = p_Var4;
        pp_Var6[*(ulong *)&(p_Var1->
                           super__Hash_node_value_base<std::pair<const_unsigned_long,_std::unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>_>_>
                           )._M_storage._M_storage % DAT_0029b950] = (_Hash_node_base *)p_Var4;
        pp_Var6 = (anonymous_namespace)::curious_insts;
        p_Var4 = DAT_0029b958;
      }
      DAT_0029b958 = p_Var4;
      pp_Var6[(long)this] = (_Hash_node_base *)&DAT_0029b958;
    }
    else {
      (p_Var4->super__Hash_node_base)._M_nxt =
           (anonymous_namespace)::curious_insts[(long)this]->_M_nxt;
      pp_Var6[(long)this]->_M_nxt = (_Hash_node_base *)p_Var4;
    }
    DAT_0029b960 = DAT_0029b960 + 1;
    local_60._M_node = (__node_ptr)0x0;
  }
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Scoped_node::~_Scoped_node(&local_60);
  std::
  unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>
  ::~unique_ptr((unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>
                 *)&local_40);
  std::
  unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>
  ::~unique_ptr(&data);
  return;
LAB_002299dd:
  (p_Var10->super__Hash_node_base)._M_nxt = &DAT_0029b958->super__Hash_node_base;
  DAT_0029b958 = p_Var10;
  pp_Var6[uVar9] = (_Hash_node_base *)&DAT_0029b958;
  if ((p_Var10->super__Hash_node_base)._M_nxt != (_Hash_node_base *)0x0) {
    p_Var7 = (_Hash_node_base *)(pp_Var6 + uVar8);
LAB_002299fc:
    p_Var7->_M_nxt = &p_Var10->super__Hash_node_base;
  }
  goto LAB_002299ae;
}

Assistant:

void init_curious_in_channel(Caliper* c, Channel* channel)
{
    channel->events().subscribe_attribute(c, io_region_attr);

    curious_t curious_inst = curious_init(CURIOUS_ALL_APIS);
    auto      data         = std::unique_ptr<user_data_t>(new user_data_t { curious_inst, *channel });

    curious_register_callback(
        curious_inst,
        CURIOUS_READ_CALLBACK,
        (curious_callback_f) handle_io<curious_read_record_t>,
        data.get()
    );
    curious_register_callback(
        curious_inst,
        CURIOUS_READ_CALLBACK | CURIOUS_POST_CALLBACK,
        (curious_callback_f) handle_io<curious_read_record_t>,
        data.get()
    );
    curious_register_callback(
        curious_inst,
        CURIOUS_WRITE_CALLBACK,
        (curious_callback_f) handle_io<curious_write_record_t>,
        data.get()
    );
    curious_register_callback(
        curious_inst,
        CURIOUS_WRITE_CALLBACK | CURIOUS_POST_CALLBACK,
        (curious_callback_f) handle_io<curious_write_record_t>,
        data.get()
    );
    curious_register_callback(
        curious_inst,
        CURIOUS_METADATA_CALLBACK,
        (curious_callback_f) handle_io<curious_metadata_record_t>,
        data.get()
    );
    curious_register_callback(
        curious_inst,
        CURIOUS_METADATA_CALLBACK | CURIOUS_POST_CALLBACK,
        (curious_callback_f) handle_io<curious_metadata_record_t>,
        data.get()
    );

    curious_insts.insert(std::make_pair(channel->id(), std::move(data)));
}